

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall TestETCaptureCoverageInternal::Run(TestETCaptureCoverageInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *extraout_RDX;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *extraout_RDX_00;
  Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<bool,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
  *t;
  string local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88 [2];
  testinator local_80 [8];
  char *local_78;
  undefined4 local_70;
  char *local_68;
  testinator *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 *local_40;
  char *local_38;
  
  local_40 = local_88;
  local_98 = 0x100000000;
  local_90 = 0x400000002;
  local_88[0] = 0;
  pOVar1 = (this->super_Test).m_op;
  local_60 = local_80;
  local_78 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_70 = 0x2a8;
  local_68 = " (1+2 > 1+3 < 0 => ";
  local_58 = " ";
  local_50 = "<";
  local_48 = " ";
  local_38 = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>,char_const*>,char_const*>,testinator::stringifier_select<int,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_b8,local_80,
             (Cons<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>,_const_char_*>,_const_char_*>,_testinator::stringifier_select<int,_testinator::default_formatter,_testinator::detail::is_outputtable_tag>_>,_const_char_*>_>
              *)0x1565e0);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_b8);
  t = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    t = extraout_RDX_00;
  }
  (this->super_Test).m_success = false;
  pOVar1 = (this->super_Test).m_op;
  local_78 = 
  "EXPECT FAILED: /workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:"
  ;
  local_70 = 0x2a9;
  local_68 = " (false => ";
  local_60 = (testinator *)((ulong)local_60 & 0xffffffffffffff00);
  local_58 = ")";
  testinator::
  Diagnostic<testinator::Cons<std::pair<std::pair<std::pair<std::pair<std::pair<testinator::Nil,char_const*>,int>,char_const*>,testinator::stringifier_select<bool,testinator::default_formatter,testinator::detail::is_outputtable_tag>>,char_const*>>>
            (&local_b8,local_80,t);
  (*pOVar1->_vptr_Outputter[3])(pOVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).m_success = false;
  return true;
}

Assistant:

virtual bool Run()
  {
    EXPECT(1+2 > 1+3 < 0);
    EXPECT(false);
    return true;
  }